

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Clip_x86_avx512::forward_inplace(Clip_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  _func_int **pp_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  uint uVar7;
  long lVar8;
  long lVar9;
  undefined1 (*pauVar10) [64];
  int iVar11;
  uint uVar12;
  uint uVar13;
  _func_int *p_Var14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined4 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  
  iVar3 = bottom_top_blob->c;
  if (0 < (long)iVar3) {
    uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    pp_Var4 = this->_vptr_Clip_x86_avx512;
    lVar9 = 0;
    do {
      pauVar10 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * lVar9 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *(ulong *)(&this->field_0xd0 + (long)pp_Var4[-3]);
      if ((int)uVar7 < 0x10) {
        uVar13 = 0;
      }
      else {
        auVar15 = vbroadcastss_avx512f(auVar19);
        auVar19 = vmovshdup_avx(auVar19);
        auVar16 = vbroadcastsd_avx512f(auVar19);
        iVar11 = 0xf;
        do {
          auVar17 = vmaxps_avx512f(auVar15,*pauVar10);
          auVar17 = vminps_avx512f(auVar17,auVar16);
          *pauVar10 = auVar17;
          pauVar10 = pauVar10 + 1;
          iVar11 = iVar11 + 0x10;
        } while (iVar11 < (int)uVar7);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)(&this->field_0xd0 + (long)pp_Var4[-3]);
        uVar13 = uVar7 & 0xfffffff0;
      }
      if ((int)(uVar13 | 7) < (int)uVar7) {
        uVar18 = auVar19._0_4_;
        auVar22._4_4_ = uVar18;
        auVar22._0_4_ = uVar18;
        auVar22._8_4_ = uVar18;
        auVar22._12_4_ = uVar18;
        auVar22._16_4_ = uVar18;
        auVar22._20_4_ = uVar18;
        auVar22._24_4_ = uVar18;
        auVar22._28_4_ = uVar18;
        auVar19 = vmovshdup_avx(auVar19);
        auVar20._0_8_ = auVar19._0_8_;
        auVar20._8_8_ = auVar20._0_8_;
        auVar20._16_8_ = auVar20._0_8_;
        auVar20._24_8_ = auVar20._0_8_;
        uVar12 = uVar13;
        do {
          auVar6 = vmaxps_avx(auVar22,*(undefined1 (*) [32])*pauVar10);
          auVar6 = vminps_avx(auVar6,auVar20);
          *(undefined1 (*) [32])*pauVar10 = auVar6;
          pauVar10 = (undefined1 (*) [64])(*pauVar10 + 0x20);
          uVar13 = uVar12 + 8;
          iVar11 = uVar12 + 0xf;
          uVar12 = uVar13;
        } while (iVar11 < (int)uVar7);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)(&this->field_0xd0 + (long)pp_Var4[-3]);
      }
      if ((int)(uVar13 | 3) < (int)uVar7) {
        uVar18 = auVar19._0_4_;
        auVar21._4_4_ = uVar18;
        auVar21._0_4_ = uVar18;
        auVar21._8_4_ = uVar18;
        auVar21._12_4_ = uVar18;
        auVar19 = vshufps_avx(auVar19,auVar19,0x55);
        uVar12 = uVar13;
        do {
          auVar5 = vmaxps_avx(auVar21,*(undefined1 (*) [16])*pauVar10);
          auVar5 = vminps_avx(auVar5,auVar19);
          *(undefined1 (*) [16])*pauVar10 = auVar5;
          pauVar10 = (undefined1 (*) [64])(*pauVar10 + 0x10);
          uVar13 = uVar12 + 4;
          iVar11 = uVar12 + 7;
          uVar12 = uVar13;
        } while (iVar11 < (int)uVar7);
      }
      if (uVar7 - uVar13 != 0 && (int)uVar13 <= (int)uVar7) {
        lVar8 = 0;
        do {
          p_Var14 = pp_Var4[-3];
          fVar1 = *(float *)(&this->field_0xd0 + (long)p_Var14);
          fVar2 = *(float *)(*pauVar10 + lVar8 * 4);
          if (*(float *)(*pauVar10 + lVar8 * 4) < fVar1) {
            *(float *)(*pauVar10 + lVar8 * 4) = fVar1;
            p_Var14 = pp_Var4[-3];
            fVar2 = fVar1;
          }
          if (*(float *)(&this->field_0xd4 + (long)p_Var14) < fVar2) {
            *(float *)(*pauVar10 + lVar8 * 4) = *(float *)(&this->field_0xd4 + (long)p_Var14);
          }
          lVar8 = lVar8 + 1;
        } while (uVar7 - uVar13 != (int)lVar8);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar3);
  }
  return 0;
}

Assistant:

int Clip_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _min_avx512 = _mm512_set1_ps(min);
        __m512 _max_avx512 = _mm512_set1_ps(max);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_max_ps(_p, _min_avx512);
            _p = _mm512_min_ps(_p, _max_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _min_avx = _mm256_set1_ps(min);
        __m256 _max_avx = _mm256_set1_ps(max);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_max_ps(_p, _min_avx);
            _p = _mm256_min_ps(_p, _max_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _min = _mm_set1_ps(min);
        __m128 _max = _mm_set1_ps(max);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_max_ps(_p, _min);
            _p = _mm_min_ps(_p, _max);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < min)
                *ptr = min;
            if (*ptr > max)
                *ptr = max;
            ptr++;
        }
    }

    return 0;
}